

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O1

void P_GetPolySpots(MapData *map,TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> *spots,
                   TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> *anchors)

{
  double dVar1;
  double dVar2;
  short sVar3;
  uint uVar4;
  long *plVar5;
  FPolyStart *pFVar6;
  long lVar7;
  ulong uVar8;
  TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart> *this;
  
  if (MapThingsConverted.Count != 0) {
    lVar7 = 0x28;
    uVar8 = 0;
    do {
      plVar5 = *(long **)((long)(MapThingsConverted.Array)->args + lVar7 + -0x38);
      if (((plVar5 != (long *)0x0) && (*plVar5 == 0)) &&
         (sVar3 = (short)(int)plVar5[1], (ushort)(sVar3 - 0xbU) < 4)) {
        this = anchors;
        if (sVar3 != 0xb) {
          this = spots;
        }
        dVar1 = *(double *)((long)(MapThingsConverted.Array)->args + lVar7 + -0x58);
        dVar2 = *(double *)((long)(MapThingsConverted.Array)->args + lVar7 + -0x50);
        sVar3 = *(short *)((long)(MapThingsConverted.Array)->args + lVar7 + -0x40);
        TArray<FNodeBuilder::FPolyStart,_FNodeBuilder::FPolyStart>::Grow(this,1);
        pFVar6 = this->Array;
        uVar4 = this->Count;
        pFVar6[uVar4].polynum = (int)sVar3;
        pFVar6[uVar4].x = SUB84(dVar1 + 103079215104.0,0);
        pFVar6[uVar4].y = SUB84(dVar2 + 103079215104.0,0);
        this->Count = this->Count + 1;
      }
      uVar8 = uVar8 + 1;
      lVar7 = lVar7 + 0x90;
    } while (uVar8 < MapThingsConverted.Count);
  }
  return;
}

Assistant:

void P_GetPolySpots (MapData * map, TArray<FNodeBuilder::FPolyStart> &spots, TArray<FNodeBuilder::FPolyStart> &anchors)
{
	//if (map->HasBehavior)
	{
		for (unsigned int i = 0; i < MapThingsConverted.Size(); ++i)
		{
			FDoomEdEntry *mentry = MapThingsConverted[i].info;
			if (mentry != NULL && mentry->Type == NULL && mentry->Special >= SMT_PolyAnchor && mentry->Special <= SMT_PolySpawnHurt)
			{
				FNodeBuilder::FPolyStart newvert;
				newvert.x = FLOAT2FIXED(MapThingsConverted[i].pos.X);
				newvert.y = FLOAT2FIXED(MapThingsConverted[i].pos.Y);
				newvert.polynum = MapThingsConverted[i].angle;
				if (mentry->Special == SMT_PolyAnchor)
				{
					anchors.Push (newvert);
				}
				else
				{
					spots.Push (newvert);
				}
			}
		}
	}
}